

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitConst(I64ToI32Lowering *this,Const *curr)

{
  bool bVar1;
  Index index;
  Function *pFVar2;
  pointer pBVar3;
  int64_t iVar4;
  Const *append;
  pointer this_00;
  Const *value;
  LocalSet *any;
  Block *e;
  Block *result;
  LocalSet *setHigh;
  Const *lowVal;
  undefined1 local_40 [8];
  TempVar highBits;
  Const *curr_local;
  I64ToI32Lowering *this_local;
  
  pFVar2 = Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::getFunction
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                       ).
                       super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                       .
                       super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                     );
  if (pFVar2 != (Function *)0x0) {
    highBits.ty.id._4_4_ = 3;
    bVar1 = wasm::Type::operator!=
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                        type,(BasicType *)((long)&highBits.ty.id + 4));
    if (!bVar1) {
      wasm::Type::Type((Type *)&lowVal,i32);
      getTemp((TempVar *)local_40,this,(Type)lowVal);
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      iVar4 = wasm::Literal::geti64(&curr->value);
      append = Builder::makeConst<int>(pBVar3,(int)iVar4);
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_40);
      this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                          (&this->builder);
      iVar4 = wasm::Literal::geti64(&curr->value);
      value = Builder::makeConst<int>(this_00,(int)((ulong)iVar4 >> 0x20));
      any = Builder::makeLocalSet(pBVar3,index,(Expression *)value);
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      e = Builder::blockify(pBVar3,(Expression *)any,(Expression *)append);
      setOutParam(this,(Expression *)e,(TempVar *)local_40);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)e);
      TempVar::~TempVar((TempVar *)local_40);
    }
  }
  return;
}

Assistant:

void visitConst(Const* curr) {
    if (!getFunction()) {
      return; // if in a global init, skip - we already handled that.
    }
    if (curr->type != Type::i64) {
      return;
    }
    TempVar highBits = getTemp();
    Const* lowVal =
      builder->makeConst(int32_t(curr->value.geti64() & 0xffffffff));
    LocalSet* setHigh = builder->makeLocalSet(
      highBits,
      builder->makeConst(int32_t(uint64_t(curr->value.geti64()) >> 32)));
    Block* result = builder->blockify(setHigh, lowVal);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }